

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  appender aVar7;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar8;
  ulong uVar9;
  uint uVar10;
  sign_t sVar11;
  int num_digits;
  uint uVar12;
  long lVar13;
  locale_ref in_stack_fffffffffffffef8;
  undefined1 local_ff;
  sign_t sign;
  char zero;
  bool pointy;
  undefined3 uStack_fb;
  int significand_size;
  significand_type significand;
  ulong local_f0;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_e8;
  basic_format_specs<char> *local_e0;
  locale_ref local_d8;
  int local_cc;
  significand_type local_c8;
  int exp;
  ulong local_c0;
  float_specs fspecs_local;
  digit_grouping<char> grouping;
  anon_class_28_8_ad0ecca5 write;
  undefined4 uStack_6c;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  significand = f->significand;
  local_e8 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  local_e0 = specs;
  local_d8.locale_ = loc.locale_;
  local_c8 = significand;
  fspecs_local = fspecs;
  iVar4 = get_significand_size<float>(f);
  zero = '0';
  sVar11 = fspecs._5_1_;
  local_f0 = (ulong)((iVar4 + 1) - (uint)(sVar11 == none));
  uVar5 = fspecs._4_4_;
  cVar2 = '.';
  sign = sVar11;
  significand_size = iVar4;
  if ((uVar5 >> 0x11 & 1) != 0) {
    cVar2 = decimal_point_impl<char>(in_stack_fffffffffffffef8);
  }
  local_c0 = (ulong)(uint)f->exponent;
  local_cc = f->exponent + iVar4 + -1;
  local_ff = cVar2;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_cc;
  bVar3 = do_write_float<fmt::v9::appender,_fmt::v9::detail::dragonbox::decimal_fp<float>,_char,_fmt::v9::detail::digit_grouping<char>_>
          ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  uVar10 = fspecs.precision;
  if (bVar3) {
    if ((uVar5 >> 0x13 & 1) == 0) {
      uVar6 = 0;
      uVar9 = local_f0;
      if (iVar4 == 1) {
        cVar2 = '\0';
      }
    }
    else {
      uVar6 = 0;
      if (0 < (int)(uVar10 - iVar4)) {
        uVar6 = (ulong)(uVar10 - iVar4);
      }
      uVar9 = local_f0 + uVar6;
    }
    write.sign = sVar11;
    write.significand = local_c8;
    write.decimal_point = cVar2;
    write.significand_size = iVar4;
    write._16_5_ = CONCAT14('0',(int)uVar6);
    write._16_8_ = CONCAT26(write._22_2_,CONCAT15(((uVar5 >> 0x10 & 1) == 0) << 5,write._16_5_)) |
                   0x450000000000;
    stack0xffffffffffffff90 = (decimal_fp<float> *)CONCAT44(uStack_6c,local_cc);
    if (0 < local_e0->width) {
      iVar1 = local_cc;
      if (iVar4 + (int)local_c0 < 1) {
        iVar1 = 1 - (iVar4 + (int)local_c0);
      }
      lVar13 = 2;
      if (99 < iVar1) {
        lVar13 = (ulong)(999 < iVar1) + 3;
      }
      aVar7 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                        ((appender)local_e8.container,local_e0,
                         uVar9 + (3 - (ulong)(cVar2 == '\0')) + lVar13,&write);
      return (appender)
             aVar7.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    aVar7 = do_write_float<fmt::v9::appender,_fmt::v9::detail::dragonbox::decimal_fp<float>,_char,_fmt::v9::detail::digit_grouping<char>_>
            ::anon_class_28_8_ad0ecca5::operator()(&write,(iterator)local_e8.container);
    return (appender)
           aVar7.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  iVar1 = f->exponent;
  num_digits = iVar4 + iVar1;
  exp = num_digits;
  if ((long)iVar1 < 0) {
    if (num_digits < 1) {
      uVar12 = -num_digits;
      grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar12;
      if (uVar10 < uVar12) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar10;
      }
      if ((int)uVar10 < 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar12;
      }
      if (iVar4 != 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar12;
      }
      if (iVar4 == 0 && (uint)grouping.sep_.grouping._M_dataplus._M_p == 0) {
        pointy = (bool)(char)((uVar5 & 0x80000) >> 0x13);
        if (((ulong)fspecs & 0x8000000000000) == 0) {
          iVar4 = 1;
          goto LAB_00121e17;
        }
      }
      else {
        pointy = true;
      }
      iVar4 = 2;
LAB_00121e17:
      write._0_8_ = &sign;
      write._8_8_ = &zero;
      write._16_8_ = &pointy;
      unique0x00004e80 = (decimal_fp<float> *)&local_ff;
      aVar7 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_>
                        ((appender)local_e8.container,local_e0,
                         (iVar4 + (uint)grouping.sep_.grouping._M_dataplus._M_p) + local_f0,
                         (anon_class_56_7_162c6e41 *)&write);
      return (appender)
             aVar7.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    uVar10 = uVar10 - iVar4 & (int)(uVar5 << 0xc) >> 0x1f;
    _pointy = uVar10;
    digit_grouping<char>::digit_grouping(&grouping,local_d8,(bool)((byte)(uVar5 >> 0x11) & 1));
    uVar5 = digit_grouping<char>::count_separators(&grouping,significand_size);
    uVar6 = 0;
    if (0 < (int)uVar10) {
      uVar6 = (ulong)uVar10;
    }
    write._0_8_ = &sign;
    write._8_8_ = &significand;
    write._16_8_ = &significand_size;
    unique0x00004e80 = (decimal_fp<float> *)&exp;
    bVar8.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_>
                   (local_e8.container,local_e0,(ulong)uVar5 + uVar6 + local_f0 + 1,
                    (anon_class_64_8_e6ffa566 *)&write);
    goto LAB_00121dad;
  }
  lVar13 = (long)iVar1 + local_f0;
  _pointy = uVar10 - num_digits;
  uVar6 = (ulong)_pointy;
  if ((uVar5 >> 0x13 & 1) != 0) {
    lVar13 = lVar13 + 1;
    if (fspecs._4_1_ == '\x02' || 0 < (int)_pointy) {
      if ((int)_pointy < 1) goto LAB_00121d23;
    }
    else {
      _pointy = 1;
      uVar6 = 1;
    }
    lVar13 = lVar13 + uVar6;
  }
LAB_00121d23:
  digit_grouping<char>::digit_grouping(&grouping,local_d8,(bool)((byte)(uVar5 >> 0x11) & 1));
  uVar5 = digit_grouping<char>::count_separators(&grouping,num_digits);
  write._0_8_ = &sign;
  write._8_8_ = &significand;
  write._16_8_ = &significand_size;
  unique0x10000346 = f;
  bVar8.container =
       (buffer<char> *)
       write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_>
                 (local_e8.container,local_e0,lVar13 + (ulong)uVar5,
                  (anon_class_72_9_0c6a3a8a *)&write);
LAB_00121dad:
  std::__cxx11::string::~string((string *)&grouping);
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar8.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}